

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
DictionaryInstance::op_associateValue_withKey
          (DictionaryInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  size_type sVar1;
  undefined8 *puVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RDI;
  string *unaff_retaddr;
  string *in_stack_00000008;
  shared_ptr<Instance> key;
  shared_ptr<Instance> value;
  shared_ptr<Instance> *in_stack_ffffffffffffff78;
  shared_ptr<Instance> *in_stack_ffffffffffffff80;
  allocator *paVar3;
  key_type *in_stack_ffffffffffffffb8;
  map<std::shared_ptr<Instance>,_std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
  *in_stack_ffffffffffffffc0;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar1 != 2) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDX,0);
  get_shared_instance(in_stack_00000008,unaff_retaddr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDX,1);
  get_shared_instance(in_stack_00000008,unaff_retaddr);
  std::
  map<std::shared_ptr<Instance>,_std::shared_ptr<Instance>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
  ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::shared_ptr<Instance>::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  paVar3 = (allocator *)&stack0xffffffffffffffbb;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"null",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbb);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c430d);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1c4317);
  return in_RDI;
}

Assistant:

std::string DictionaryInstance::op_associateValue_withKey(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> value = get_shared_instance(_value_type, arguments[0]);
    std::shared_ptr<Instance> key = get_shared_instance(_key_type, arguments[1]);
    _value[key] = value;
    return "null";
}